

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O0

char * hdr_strerror(int errnum)

{
  char *pcStack_10;
  int errnum_local;
  
  switch(errnum) {
  case -29999:
    pcStack_10 = "Compression cookie mismatch";
    break;
  case -0x752e:
    pcStack_10 = "Encoding cookie mismatch";
    break;
  case -0x752d:
    pcStack_10 = "Deflate initialisation failed";
    break;
  case -0x752c:
    pcStack_10 = "Deflate failed";
    break;
  case -0x752b:
    pcStack_10 = "Inflate initialisation failed";
    break;
  case -0x752a:
    pcStack_10 = "Inflate failed";
    break;
  case -0x7529:
    pcStack_10 = "Log - invalid version in log header";
    break;
  case -0x7528:
    pcStack_10 = "Invalid number of trailing zeros";
    break;
  case -0x7527:
    pcStack_10 = "Truncated value found when decoding";
    break;
  case -0x7526:
    pcStack_10 = "The encoded input exceeds the size of the histogram";
    break;
  case -0x7525:
    pcStack_10 = "Invalid word size";
    break;
  default:
    pcStack_10 = strerror(errnum);
  }
  return pcStack_10;
}

Assistant:

const char* hdr_strerror(int errnum)
{
    switch (errnum)
    {
        case HDR_COMPRESSION_COOKIE_MISMATCH:
            return "Compression cookie mismatch";
        case HDR_ENCODING_COOKIE_MISMATCH:
            return "Encoding cookie mismatch";
        case HDR_DEFLATE_INIT_FAIL:
            return "Deflate initialisation failed";
        case HDR_DEFLATE_FAIL:
            return "Deflate failed";
        case HDR_INFLATE_INIT_FAIL:
            return "Inflate initialisation failed";
        case HDR_INFLATE_FAIL:
            return "Inflate failed";
        case HDR_LOG_INVALID_VERSION:
            return "Log - invalid version in log header";
        case HDR_TRAILING_ZEROS_INVALID:
            return "Invalid number of trailing zeros";
        case HDR_VALUE_TRUNCATED:
            return "Truncated value found when decoding";
        case HDR_ENCODED_INPUT_TOO_LONG:
            return "The encoded input exceeds the size of the histogram";
        case HDR_INVALID_WORD_SIZE:
            return "Invalid word size";
        default:
            return strerror(errnum);
    }
}